

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void ScanPair(ConfigScanner *sc)

{
  _Bool _Var1;
  ConfigScanner *in_RDI;
  ConfigScanner *in_stack_00000008;
  
  if (in_RDI != (ConfigScanner *)0x0) {
    SkipSpace(in_RDI);
    _Var1 = GetKeyWord(in_stack_00000008);
    if (_Var1) {
      SkipSpace(in_RDI);
      _Var1 = GetEQ(in_RDI);
      if (_Var1) {
        SkipSpace(in_RDI);
        ScanValue(in_stack_00000008);
      }
    }
  }
  return;
}

Assistant:

void ScanPair(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	SkipSpace(sc);
	if (!GetKeyWord(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!GetEQ(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!ScanValue(sc))
	{
		return;
	}
	return;
}